

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O3

void __thiscall ASDCP::MXF::FileDescriptor::Copy(FileDescriptor *this,FileDescriptor *rhs)

{
  undefined8 uVar1;
  
  GenericDescriptor::Copy(&this->super_GenericDescriptor,&rhs->super_GenericDescriptor);
  (this->LinkedTrackID).m_has_value = (rhs->LinkedTrackID).m_has_value;
  (this->LinkedTrackID).m_property = (rhs->LinkedTrackID).m_property;
  (this->SampleRate).super_Rational = (rhs->SampleRate).super_Rational;
  (this->ContainerDuration).m_has_value = (rhs->ContainerDuration).m_has_value;
  (this->ContainerDuration).m_property = (rhs->ContainerDuration).m_property;
  (this->EssenceContainer).super_Identifier<16U>.m_HasValue =
       (rhs->EssenceContainer).super_Identifier<16U>.m_HasValue;
  uVar1 = *(undefined8 *)((rhs->EssenceContainer).super_Identifier<16U>.m_Value + 8);
  *(undefined8 *)(this->EssenceContainer).super_Identifier<16U>.m_Value =
       *(undefined8 *)(rhs->EssenceContainer).super_Identifier<16U>.m_Value;
  *(undefined8 *)((this->EssenceContainer).super_Identifier<16U>.m_Value + 8) = uVar1;
  (this->Codec).m_property.super_Identifier<16U>.m_HasValue =
       (rhs->Codec).m_property.super_Identifier<16U>.m_HasValue;
  uVar1 = *(undefined8 *)((rhs->Codec).m_property.super_Identifier<16U>.m_Value + 8);
  *(undefined8 *)(this->Codec).m_property.super_Identifier<16U>.m_Value =
       *(undefined8 *)(rhs->Codec).m_property.super_Identifier<16U>.m_Value;
  *(undefined8 *)((this->Codec).m_property.super_Identifier<16U>.m_Value + 8) = uVar1;
  (this->Codec).m_has_value = (rhs->Codec).m_has_value;
  return;
}

Assistant:

void
FileDescriptor::Copy(const FileDescriptor& rhs)
{
  GenericDescriptor::Copy(rhs);
  LinkedTrackID = rhs.LinkedTrackID;
  SampleRate = rhs.SampleRate;
  ContainerDuration = rhs.ContainerDuration;
  EssenceContainer = rhs.EssenceContainer;
  Codec = rhs.Codec;
}